

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O1

void writeTiledRgbaMIP2(char *fileName,int width,int height,int tileWidth,int tileHeight)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int h;
  undefined8 uVar4;
  int level;
  int xLevel;
  int tileY;
  int iVar5;
  int tileX;
  Box2i range;
  Array2D<Imf_3_2::Rgba> pixels;
  undefined8 local_50;
  TiledRgbaOutputFile out;
  
  local_50 = 0;
  uVar4 = Imf_3_2::globalThreadCount();
  xLevel = 0;
  Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,0x3f800000,&out,fileName,width,height,tileWidth,
             tileHeight,1,0,0xf,&local_50,0,3,uVar4);
  pixels._sizeX = (long)tileHeight;
  pixels._sizeY = (long)tileWidth;
  pixels._data = (Rgba *)operator_new__(-(ulong)((ulong)(pixels._sizeX * pixels._sizeY) >> 0x3d != 0
                                                ) | pixels._sizeX * pixels._sizeY * 8);
  while( true ) {
    iVar1 = Imf_3_2::TiledRgbaOutputFile::numLevels();
    if (iVar1 <= xLevel) break;
    iVar1 = 0;
    while( true ) {
      iVar5 = (int)(Rgba *)&out;
      iVar2 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar5);
      if (iVar2 <= iVar1) break;
      iVar2 = 0;
      while( true ) {
        iVar3 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar5);
        if (iVar3 <= iVar2) break;
        Imf_3_2::TiledRgbaOutputFile::dataWindowForTile((int)&range,iVar5,iVar2);
        iVar3 = Imf_3_2::TiledRgbaOutputFile::levelWidth(iVar5);
        h = Imf_3_2::TiledRgbaOutputFile::levelHeight(iVar5);
        drawImage4(&pixels,iVar3,h,range.min.x,range.max.x + 1,range.min.y,range.max.y + 1,xLevel,
                   xLevel);
        Imf_3_2::TiledRgbaOutputFile::setFrameBuffer
                  ((Rgba *)&out,
                   (ulong)(pixels._data + (-(long)range.min.y * pixels._sizeY - (long)range.min.x)),
                   1);
        Imf_3_2::TiledRgbaOutputFile::writeTile(iVar5,iVar2,iVar1);
        iVar2 = iVar2 + 1;
      }
      iVar1 = iVar1 + 1;
    }
    xLevel = xLevel + 1;
  }
  if (pixels._data != (Rgba *)0x0) {
    operator_delete__(pixels._data);
  }
  Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
  return;
}

Assistant:

void
writeTiledRgbaMIP2 (
    const char fileName[], int width, int height, int tileWidth, int tileHeight)
{
    //
    // Write a tiled image with mipmap levels using a tile-sized framebuffer.
    //

    TiledRgbaOutputFile out (
        fileName,
        width,
        height, // image size
        tileWidth,
        tileHeight,    // tile size
        MIPMAP_LEVELS, // level mode
        ROUND_DOWN,    // rounding mode
        WRITE_RGBA);   // channels in file

    Array2D<Rgba> pixels (tileHeight, tileWidth);

    for (int level = 0; level < out.numLevels (); ++level)
    {
        for (int tileY = 0; tileY < out.numYTiles (level); ++tileY)
        {
            for (int tileX = 0; tileX < out.numXTiles (level); ++tileX)
            {
                Box2i range = out.dataWindowForTile (tileX, tileY, level);

                drawImage4 (
                    pixels,
                    out.levelWidth (level),
                    out.levelHeight (level),
                    range.min.x,
                    range.max.x + 1,
                    range.min.y,
                    range.max.y + 1,
                    level,
                    level);

                out.setFrameBuffer (
                    &pixels[-range.min.y][-range.min.x],
                    1,          // xStride
                    tileWidth); // yStride

                out.writeTile (tileX, tileY, level);
            }
        }
    }
}